

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::set_section(string *section_name)

{
  bool bVar1;
  __type _Var2;
  reference ppSVar3;
  Section *this;
  uint flags;
  uint number;
  ulong __n;
  string local_50;
  Section *local_30;
  
  bVar1 = std::operator==(section_name,".bss");
  if (bVar1) {
    flags = 2;
  }
  else {
    bVar1 = std::operator==(section_name,".stack");
    flags = (uint)!bVar1;
  }
  if ((DAT_0013caa8 - table == 8) &&
     (ppSVar3 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                          ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,0),
     (*ppSVar3)->content_size == 0)) {
    ppSVar3 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,0);
    std::__cxx11::string::_M_assign((string *)*ppSVar3);
    ppSVar3 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,0);
    (*ppSVar3)->flags = flags;
    return;
  }
  number = 0;
  do {
    __n = (ulong)number;
    if ((ulong)(DAT_0013caa8 - table >> 3) <= __n) {
      this = (Section *)operator_new(0x40);
      std::__cxx11::string::string((string *)&local_50,(string *)section_name);
      Section::Section(this,&local_50,number,flags);
      local_30 = this;
      std::vector<ast::Section*,std::allocator<ast::Section*>>::emplace_back<ast::Section*>
                ((vector<ast::Section*,std::allocator<ast::Section*>> *)&table,&local_30);
      std::__cxx11::string::~string((string *)&local_50);
      ppSVar3 = (reference)(DAT_0013caa8 + -8);
LAB_0011fb9d:
      current_section = *ppSVar3;
      return;
    }
    ppSVar3 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,__n);
    _Var2 = std::operator==(section_name,&(*ppSVar3)->name);
    if (_Var2) {
      ppSVar3 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                          ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,__n);
      goto LAB_0011fb9d;
    }
    number = number + 1;
  } while( true );
}

Assistant:

void Sections::set_section(std::string section_name)
{
	unsigned section_flags = 0;
	if (section_name == ".bss")
		section_flags = Section::BSS;
	else if (section_name == ".stack")
		;
	else
		section_flags = Section::LOADABLE;

	/* A secção .text é sempre criada inicialmente.
	 * Se o utilizador não definir uma secção inicial esta é utilizada.
	 * Se o utilizador começar por definir uma secção,
	 * esta vai substituir a secção .text inicialmente criada.
	 */
	if (table.size() == 1 && table.at(0)->content_size == 0) {
		table.at(0)->name = section_name;
		table.at(0)->flags = section_flags;
		return;
	}

	unsigned section_number;
	for (section_number = 0; section_number < table.size(); ++section_number)
		if (section_name == table.at(section_number)->name) {
			current_section = table.at(section_number);
			return;	/* A secção já existe */
		}
	/* Cria a nova secção */
	table.push_back(new Section {section_name, section_number, section_flags});
	current_section = table.back();
}